

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

pair<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_bool>
* __thiscall
pstore::json::details::object_matcher<callbacks_proxy<mock_json_callbacks>_>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_bool>
           *__return_storage_ptr__,object_matcher<callbacks_proxy<mock_json_callbacks>_> *this,
          parser<callbacks_proxy<mock_json_callbacks>_> *parser,maybe<char,_void> *ch)

{
  byte bVar1;
  int iVar2;
  _Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
  _Var3;
  bool bVar4;
  uint uVar5;
  byte *pbVar6;
  ulong uVar7;
  error_category *peVar8;
  matcher<callbacks_proxy<mock_json_callbacks>_> *pmVar9;
  error_category *extraout_RDX;
  undefined8 uVar10;
  error_code err;
  error_code err_00;
  
  if ((this->super_matcher<callbacks_proxy<mock_json_callbacks>_>).state_ == 1) {
    if ((parser->error_)._M_value == 0) {
      assert_failed("parser.last_error ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                    ,0x4f6);
    }
LAB_0013454f:
    *(undefined8 *)
     &(__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
         = 0;
    (__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
    .
    super__Head_base<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_false>
    ._M_head_impl = (matcher<callbacks_proxy<mock_json_callbacks>_> *)0x0;
    (__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
    .
    super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
    .
    super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>,_false>
         = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>,_false>
            )0x1;
    (__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
    .
    super__Head_base<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_false>
    ._M_head_impl = (matcher<callbacks_proxy<mock_json_callbacks>_> *)0x0;
LAB_00134560:
    bVar4 = true;
  }
  else {
    if (ch->valid_ == false) {
LAB_0013452e:
      peVar8 = get_error_category();
      uVar10 = 7;
LAB_0013453b:
      err_00._M_cat = peVar8;
      err_00._0_8_ = uVar10;
      bVar4 = parser<callbacks_proxy<mock_json_callbacks>_>::set_error(parser,err_00);
      if (bVar4) {
LAB_00134547:
        (this->super_matcher<callbacks_proxy<mock_json_callbacks>_>).state_ = 1;
      }
      goto LAB_0013454f;
    }
    pbVar6 = (byte *)maybe<char,_void>::operator->(ch);
    iVar2 = (this->super_matcher<callbacks_proxy<mock_json_callbacks>_>).state_;
    if (6 < iVar2 - 1U) goto LAB_0013454f;
    bVar1 = *pbVar6;
    uVar7 = (ulong)bVar1;
    switch(iVar2) {
    case 1:
      assert_failed("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                    ,0x536);
    case 2:
      if (bVar1 != 0x7b) {
        assert_failed("c == \'{\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                      ,0x500);
      }
      (this->super_matcher<callbacks_proxy<mock_json_callbacks>_>).state_ = 3;
      uVar5 = (*(((parser->callbacks_).original_)->super_json_callbacks_base).
                _vptr_json_callbacks_base[10])();
      err._4_4_ = 0;
      err._M_value = uVar5;
      err._M_cat = extraout_RDX;
      bVar4 = parser<callbacks_proxy<mock_json_callbacks>_>::set_error(parser,err);
      if (bVar4) goto LAB_00134547;
LAB_001344fa:
      _Var3._M_head_impl =
           (parser->singletons_)._M_t.
           super___uniq_ptr_impl<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
           .
           super__Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
           ._M_head_impl;
      *(undefined4 *)((long)((_Var3._M_head_impl)->terminal).__data + 8) = 2;
      ((_Var3._M_head_impl)->terminal).__align =
           (anon_struct_8_0_00000001_for___align)&PTR__matcher_001be478;
      (__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
      .
      super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
      .
      super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>,_false>
           = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>,_false>
              )0x0;
      (__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
      .
      super__Head_base<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_false>
      ._M_head_impl =
           (matcher<callbacks_proxy<mock_json_callbacks>_> *)&(_Var3._M_head_impl)->terminal;
      goto LAB_00134560;
    case 3:
      if (bVar1 == 0x7d) goto LAB_00134521;
    case 4:
      (this->super_matcher<callbacks_proxy<mock_json_callbacks>_>).state_ = 5;
      _Var3._M_head_impl =
           (parser->singletons_)._M_t.
           super___uniq_ptr_impl<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
           .
           super__Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
           ._M_head_impl;
      pmVar9 = (matcher<callbacks_proxy<mock_json_callbacks>_> *)&(_Var3._M_head_impl)->root;
      *(undefined4 *)((long)((_Var3._M_head_impl)->root).__data + 8) = 2;
      ((_Var3._M_head_impl)->root).__align =
           (anon_struct_8_0_00000001_for___align)&PTR__matcher_001be4b8;
      *(undefined1 *)((long)((_Var3._M_head_impl)->root).__data + 0xc) = 1;
      break;
    case 5:
      if (0x3a < bVar1) {
LAB_0013456e:
        peVar8 = get_error_category();
        uVar10 = 3;
        goto LAB_0013453b;
      }
      if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) {
        if (uVar7 == 0x3a) {
          (this->super_matcher<callbacks_proxy<mock_json_callbacks>_>).state_ = 6;
          goto LAB_0013454f;
        }
        goto LAB_0013456e;
      }
LAB_001344ba:
      _Var3._M_head_impl =
           (parser->singletons_)._M_t.
           super___uniq_ptr_impl<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
           .
           super__Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
           ._M_head_impl;
      pmVar9 = (matcher<callbacks_proxy<mock_json_callbacks>_> *)&(_Var3._M_head_impl)->terminal;
      *(undefined4 *)((long)((_Var3._M_head_impl)->terminal).__data + 8) = 2;
      ((_Var3._M_head_impl)->terminal).__align =
           (anon_struct_8_0_00000001_for___align)&PTR__matcher_001be478;
      break;
    case 6:
      (this->super_matcher<callbacks_proxy<mock_json_callbacks>_>).state_ = 7;
      _Var3._M_head_impl =
           (parser->singletons_)._M_t.
           super___uniq_ptr_impl<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
           .
           super__Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
           ._M_head_impl;
      *(undefined4 *)((long)((_Var3._M_head_impl)->root).__data + 8) = 2;
      ((_Var3._M_head_impl)->root).__align =
           (anon_struct_8_0_00000001_for___align)&PTR__matcher_001be4b8;
      bVar4 = false;
      *(undefined1 *)((long)((_Var3._M_head_impl)->root).__data + 0xc) = 0;
      (__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
      .
      super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
      .
      super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>,_false>
           = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>,_false>
              )0x0;
      (__return_storage_ptr__->first)._M_t.
      super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
      .
      super__Head_base<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_false>
      ._M_head_impl = (matcher<callbacks_proxy<mock_json_callbacks>_> *)&(_Var3._M_head_impl)->root;
      goto LAB_00134562;
    case 7:
      if (bVar1 < 0x2d) {
        if ((0x100002600U >> (uVar7 & 0x3f) & 1) != 0) goto LAB_001344ba;
        if (uVar7 == 0x2c) {
          (this->super_matcher<callbacks_proxy<mock_json_callbacks>_>).state_ =
               ((parser->extensions_ & object_trailing_comma) == none) + 3;
          goto LAB_001344fa;
        }
      }
      if (bVar1 != 0x7d) goto LAB_0013452e;
LAB_00134521:
      end_object(this,parser);
      goto LAB_0013454f;
    }
    (__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
    .
    super__Tuple_impl<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
    .
    super__Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>,_false>
         = (_Head_base<1UL,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>,_false>
            )0x0;
    (__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
    .
    super__Head_base<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_false>
    ._M_head_impl = pmVar9;
    bVar4 = false;
  }
LAB_00134562:
  __return_storage_ptr__->second = bVar4;
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            object_matcher<Callbacks>::consume (parser<Callbacks> & parser, maybe<char> ch) {
                if (this->get_state () == done_state) {
                    PSTORE_ASSERT (parser.last_error ());
                    return {nullptr, true};
                }
                if (!ch) {
                    this->set_error (parser, error_code::expected_object_member);
                    return {nullptr, true};
                }
                char const c = *ch;
                switch (this->get_state ()) {
                case start_state:
                    PSTORE_ASSERT (c == '{');
                    this->set_state (first_key_state);
                    if (this->set_error (parser, parser.callbacks ().begin_object ())) {
                        break;
                    }
                    return {this->make_whitespace_matcher (parser), true};
                case first_key_state:
                    // We allow either a closing brace (to end the object) or a property name.
                    if (c == '}') {
                        this->end_object (parser);
                        break;
                    }
                    PSTORE_FALLTHROUGH;
                case key_state:
                    // Match a property name then expect a colon.
                    this->set_state (colon_state);
                    return {this->make_root_matcher (parser, true /*object key?*/), false};
                case colon_state:
                    if (isspace (c)) {
                        // just consume whitespace before the colon.
                        return {this->make_whitespace_matcher (parser), false};
                    }
                    if (c == ':') {
                        this->set_state (value_state);
                    } else {
                        this->set_error (parser, error_code::expected_colon);
                    }
                    break;
                case value_state:
                    this->set_state (comma_state);
                    return {this->make_root_matcher (parser), false};
                case comma_state:
                    if (isspace (c)) {
                        // just consume whitespace before the comma.
                        return {this->make_whitespace_matcher (parser), false};
                    }
                    if (c == ',') {
                        // Strictly conforming JSON requires a property name following a comma but
                        // we have an extension to allow an trailing comma which may be followed by
                        // the object's closing brace.
                        this->set_state (
                            (parser.extension_enabled (extensions::object_trailing_comma))
                                ? first_key_state
                                : key_state);
                        // Consume the comma and any whitespace before the close brace or property
                        // name.
                        return {this->make_whitespace_matcher (parser), true};
                    }
                    if (c == '}') {
                        this->end_object (parser);
                    } else {
                        this->set_error (parser, error_code::expected_object_member);
                    }
                    break;
                case done_state: PSTORE_ASSERT (false); break;
                }
                // No change of matcher. Consume the input character.
                return {nullptr, true};
            }